

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

FloatParts round_canonical(FloatParts p,float_status *s,FloatFmt *parm)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  int line;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  FloatParts FVar13;
  ulong uStack_60;
  ulong local_50;
  ulong local_38;
  
  uVar7 = p._8_8_;
  local_38 = p.frac;
  uVar6 = parm->frac_lsb;
  uVar2 = parm->frac_lsbm1;
  uVar3 = parm->round_mask;
  uVar4 = parm->roundeven_mask;
  uVar11 = parm->exp_max;
  bVar5 = (byte)parm->frac_shift;
  switch(p._12_4_ & 0xff) {
  case 1:
    uStack_60 = 0;
    uVar11 = 0;
    break;
  case 2:
    cVar1 = s->float_rounding_mode;
    switch(cVar1) {
    case '\0':
      bVar12 = false;
      local_50 = 0;
      if ((uVar4 & local_38) != uVar2) {
        local_50 = uVar2;
      }
      break;
    case '\x01':
      bVar12 = (uVar7 >> 0x28 & 1) == 0;
      local_50 = (long)(uVar7 << 0x17) >> 0x3f & uVar3;
      break;
    case '\x02':
      bVar12 = (bool)(p.sign & 1);
      local_50 = 0;
      if (((undefined1  [16])p & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
        local_50 = uVar3;
      }
      break;
    case '\x03':
      bVar12 = true;
      local_50 = 0;
      break;
    case '\x04':
      bVar12 = false;
      local_50 = uVar2;
      break;
    case '\x05':
      local_50 = 0;
      if ((uVar6 & local_38) == 0) {
        local_50 = uVar3;
      }
      bVar12 = true;
      break;
    default:
      line = 0x2ee;
      goto LAB_00b20766;
    }
    uVar10 = parm->exp_bias + p.exp;
    if (uVar10 == 0 || SCARRY4(parm->exp_bias,p.exp) != (int)uVar10 < 0) {
      if (s->flush_to_zero == '\0') {
        bVar12 = true;
        if ((uVar10 == 0) && (s->float_detect_tininess != '\x01')) {
          bVar12 = -1 < (long)(local_50 + local_38);
        }
        shift64RightJamming(local_38,1 - uVar10,&local_38);
        if ((local_38 & uVar3) == 0) {
          bVar9 = 0;
          local_50 = local_38;
        }
        else {
          if (cVar1 == '\x05') {
            local_50 = 0;
            if ((local_38 & uVar6) == 0) {
              local_50 = uVar3;
            }
          }
          else if ((cVar1 == '\0') && (local_50 = 0, (uVar4 & local_38) != uVar2)) {
            local_50 = uVar2;
          }
          local_50 = local_50 + local_38;
          bVar9 = 0x20;
        }
        uStack_60 = local_50 >> (bVar5 & 0x3f);
        bVar8 = bVar9 | 0x10;
        if ((local_38 & uVar3) == 0) {
          bVar8 = bVar9;
        }
        if (!bVar12) {
          bVar8 = bVar9;
        }
        uVar6 = uVar7 & 0xffffff00ffffffff | 0x100000000;
        if (uStack_60 != 0) {
          uVar6 = uVar7;
        }
        uVar10 = (uint)(local_50 >> 0x3e) & 1;
        if (uVar10 == 0) {
          uVar7 = uVar6;
        }
      }
      else {
        bVar8 = 0x80;
        uStack_60 = 0;
        uVar10 = 0;
        uVar7 = uVar7 & 0xffffff00ffffffff | 0x100000000;
      }
      goto LAB_00b205c0;
    }
    if ((uVar3 & local_38) == 0) {
      bVar8 = 0;
      local_50 = local_38;
    }
    else {
      local_50 = local_38 + local_50;
      bVar8 = 0x20;
      if ((long)local_50 < 0) {
        uVar10 = uVar10 + 1;
        local_50 = local_50 >> 1;
      }
    }
    uStack_60 = local_50 >> (bVar5 & 0x3f);
    bVar5 = parm->arm_althp;
    if ((_Bool)bVar5 == true) {
      if ((int)uVar10 <= (int)uVar11) goto LAB_00b205c0;
      bVar8 = 1;
    }
    else {
      if ((int)uVar10 < (int)uVar11) goto LAB_00b205c0;
      if (bVar12 == false) {
        uVar7 = uVar7 & 0xffffff00ffffffff | 0x300000000;
        bVar8 = 0x28;
        goto LAB_00b204e3;
      }
      uVar11 = uVar11 - 1;
      bVar8 = 0x28;
    }
    uStack_60 = 0xffffffffffffffff;
    uVar10 = uVar11;
    goto LAB_00b205c0;
  case 3:
    bVar5 = parm->arm_althp;
    bVar8 = 0;
LAB_00b204e3:
    if ((bVar5 & 1) != 0) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x33e,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    uStack_60 = 0;
    uVar10 = uVar11;
    goto LAB_00b205c0;
  case 4:
  case 5:
    if (parm->arm_althp == true) {
      __assert_fail("!parm->arm_althp",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                    ,0x345,
                    "FloatParts round_canonical(FloatParts, float_status *, const FloatFmt *)");
    }
    uStack_60 = local_38 >> (bVar5 & 0x3f);
    break;
  default:
    line = 0x34b;
LAB_00b20766:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,line,(char *)0x0);
  }
  bVar8 = 0;
  uVar10 = uVar11;
LAB_00b205c0:
  s->float_exception_flags = s->float_exception_flags | bVar8;
  FVar13._8_8_ = uVar7 & 0xffffffff00000000 | (ulong)uVar10;
  FVar13.frac = uStack_60;
  return FVar13;
}

Assistant:

static FloatParts round_canonical(FloatParts p, float_status *s,
                                  const FloatFmt *parm)
{
    const uint64_t frac_lsb = parm->frac_lsb;
    const uint64_t frac_lsbm1 = parm->frac_lsbm1;
    const uint64_t round_mask = parm->round_mask;
    const uint64_t roundeven_mask = parm->roundeven_mask;
    const int exp_max = parm->exp_max;
    const int frac_shift = parm->frac_shift;
    uint64_t frac, inc = 0;
    int exp, flags = 0;
    bool overflow_norm = false;

    frac = p.frac;
    exp = p.exp;

    switch (p.cls) {
    case float_class_normal:
        switch (s->float_rounding_mode) {
        case float_round_nearest_even:
            overflow_norm = false;
            inc = ((frac & roundeven_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
            break;
        case float_round_ties_away:
            overflow_norm = false;
            inc = frac_lsbm1;
            break;
        case float_round_to_zero:
            overflow_norm = true;
            inc = 0;
            break;
        case float_round_up:
            inc = p.sign ? 0 : round_mask;
            overflow_norm = p.sign;
            break;
        case float_round_down:
            inc = p.sign ? round_mask : 0;
            overflow_norm = !p.sign;
            break;
        case float_round_to_odd:
            overflow_norm = true;
            inc = frac & frac_lsb ? 0 : round_mask;
            break;
        default:
            g_assert_not_reached();
            break;
        }

        exp += parm->exp_bias;
        if (likely(exp > 0)) {
            if (frac & round_mask) {
                flags |= float_flag_inexact;
                frac += inc;
                if (frac & DECOMPOSED_OVERFLOW_BIT) {
                    frac >>= 1;
                    exp++;
                }
            }
            frac >>= frac_shift;

            if (parm->arm_althp) {
                /* ARM Alt HP eschews Inf and NaN for a wider exponent.  */
                if (unlikely(exp > exp_max)) {
                    /* Overflow.  Return the maximum normal.  */
                    flags = float_flag_invalid;
                    exp = exp_max;
                    frac = -1;
                }
            } else if (unlikely(exp >= exp_max)) {
                flags |= float_flag_overflow | float_flag_inexact;
                if (overflow_norm) {
                    exp = exp_max - 1;
                    frac = -1;
                } else {
                    p.cls = float_class_inf;
                    goto do_inf;
                }
            }
        } else if (s->flush_to_zero) {
            flags |= float_flag_output_denormal;
            p.cls = float_class_zero;
            goto do_zero;
        } else {
            bool is_tiny = (s->float_detect_tininess
                            == float_tininess_before_rounding)
                        || (exp < 0)
                        || !((frac + inc) & DECOMPOSED_OVERFLOW_BIT);

            shift64RightJamming(frac, 1 - exp, &frac);
            if (frac & round_mask) {
                /* Need to recompute round-to-even.  */
                switch (s->float_rounding_mode) {
                case float_round_nearest_even:
                    inc = ((frac & roundeven_mask) != frac_lsbm1
                           ? frac_lsbm1 : 0);
                    break;
                case float_round_to_odd:
                    inc = frac & frac_lsb ? 0 : round_mask;
                    break;
                }
                flags |= float_flag_inexact;
                frac += inc;
            }

            exp = (frac & DECOMPOSED_IMPLICIT_BIT ? 1 : 0);
            frac >>= frac_shift;

            if (is_tiny && (flags & float_flag_inexact)) {
                flags |= float_flag_underflow;
            }
            if (exp == 0 && frac == 0) {
                p.cls = float_class_zero;
            }
        }
        break;

    case float_class_zero:
    do_zero:
        exp = 0;
        frac = 0;
        break;

    case float_class_inf:
    do_inf:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac = 0;
        break;

    case float_class_qnan:
    case float_class_snan:
        assert(!parm->arm_althp);
        exp = exp_max;
        frac >>= parm->frac_shift;
        break;

    default:
        g_assert_not_reached();
        break;
    }

    float_raise(flags, s);
    p.exp = exp;
    p.frac = frac;
    return p;
}